

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::setDefaultAction(QToolButton *this,QAction *action)

{
  QToolButtonPrivate *this_00;
  bool bVar1;
  bool bVar2;
  QMenu *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_68;
  QAction *action_local;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  action_local = action;
  bVar1 = QToolButtonPrivate::hasMenu(this_00);
  this_00->defaultAction = action;
  if (action != (QAction *)0x0) {
    QWidget::actions((QList<QAction_*> *)&local_68,(QWidget *)this);
    bVar2 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                      ((QListSpecialMethodsBase<QAction*> *)&local_68,&action_local);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_68);
    if (!bVar2) {
      QWidget::addAction((QWidget *)this,action_local);
    }
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QAction::iconText();
    if (*(long *)(*(long *)(action_local + 8) + 0xb0) == 0) {
      QString::replace((QLatin1String *)&local_68,(QLatin1String *)0x1,0x6589a5);
    }
    QAbstractButton::setText(&this->super_QAbstractButton,(QString *)&local_68);
    QAction::icon();
    QAbstractButton::setIcon(&this->super_QAbstractButton,(QIcon *)&local_40);
    QIcon::~QIcon((QIcon *)&local_40);
    QAction::toolTip();
    QWidget::setToolTip((QWidget *)this,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QAction::statusTip();
    QWidget::setStatusTip((QWidget *)this,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QAction::whatsThis();
    QWidget::setWhatsThis((QWidget *)this,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    pQVar3 = QAction::menu<QMenu*>(action_local);
    if (!bVar1 && pQVar3 != (QMenu *)0x0) {
      *(undefined4 *)(*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x2e8) = 1;
    }
    bVar1 = (bool)QAction::isCheckable();
    QAbstractButton::setCheckable(&this->super_QAbstractButton,bVar1);
    bVar1 = (bool)QAction::isChecked();
    QAbstractButton::setChecked(&this->super_QAbstractButton,bVar1);
    bVar1 = (bool)QAction::isEnabled();
    QWidget::setEnabled((QWidget *)this,bVar1);
    if ((*(byte *)(*(long *)(action_local + 8) + 0x189) & 1) != 0) {
      QAction::font();
      QWidget::setFont((QWidget *)this,(QFont *)&local_40);
      QFont::~QFont((QFont *)&local_40);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::setDefaultAction(QAction *action)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    bool hadMenu = false;
    hadMenu = d->hasMenu();
#endif
    d->defaultAction = action;
    if (!action)
        return;
    if (!actions().contains(action))
        addAction(action);
    QString buttonText = action->iconText();
    // If iconText() is generated from text(), we need to escape any '&'s so they
    // don't turn into shortcuts
    if (QActionPrivate::get(action)->iconText.isEmpty())
        buttonText.replace("&"_L1, "&&"_L1);
    setText(buttonText);
    setIcon(action->icon());
#if QT_CONFIG(tooltip)
    setToolTip(action->toolTip());
#endif
#if QT_CONFIG(statustip)
    setStatusTip(action->statusTip());
#endif
#if QT_CONFIG(whatsthis)
    setWhatsThis(action->whatsThis());
#endif
#if QT_CONFIG(menu)
    if (action->menu() && !hadMenu) {
        // new 'default' popup mode defined introduced by tool bar. We
        // should have changed QToolButton's default instead. Do that
        // in 4.2.
        setPopupMode(QToolButton::MenuButtonPopup);
    }
#endif
    setCheckable(action->isCheckable());
    setChecked(action->isChecked());
    setEnabled(action->isEnabled());
    if (action->d_func()->fontSet)
        setFont(action->font());
}